

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

size_t mi_usable_size(void *p)

{
  ulong uVar1;
  mi_block_t *pmVar2;
  long lVar3;
  
  uVar1 = (long)p - 1U & 0xfffffffffe000000;
  if ((long)uVar1 < 1) {
    return 0;
  }
  lVar3 = ((long)p - uVar1 >> 0x10) * 0x60;
  lVar3 = (uVar1 + lVar3) - (ulong)*(uint *)(uVar1 + 0x124 + lVar3);
  if ((*(byte *)(lVar3 + 0x12e) & 2) == 0) {
    return *(size_t *)(lVar3 + 0x148);
  }
  pmVar2 = _mi_page_ptr_unalign((mi_page_t *)(lVar3 + 0x120),p);
  return (long)pmVar2 + (*(long *)(lVar3 + 0x148) - (long)p);
}

Assistant:

static inline mi_segment_t* _mi_ptr_segment(const void* p) {
  mi_segment_t* const segment = (mi_segment_t*)(((uintptr_t)p - 1) & ~MI_SEGMENT_MASK);
  #if MI_INTPTR_SIZE <= 4
  return (p==NULL ? NULL : segment);
  #else
  return ((intptr_t)segment <= 0 ? NULL : segment);
  #endif
}